

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclWorker.cpp
# Opt level: O1

void __thiscall xmrig::OclWorker::start(OclWorker *this)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  cl_uint results [256];
  timespec local_448;
  uint32_t local_438 [255];
  uint local_3c;
  
  do {
    if (DAT_001b1e48 == 0) {
      return;
    }
    if (((Nonce::m_paused & 1) != 0) || ((ready & 1) == 0)) {
      OclSharedData::setResumeCounter(this->m_sharedData,0);
      do {
        local_448.tv_sec = 0;
        local_448.tv_nsec = 200000000;
        do {
          iVar4 = nanosleep(&local_448,&local_448);
          if (iVar4 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
      } while ((((Nonce::m_paused & 1) != 0) || ((ready & 1) == 0)) && (DAT_001b1e48 != 0));
      if (DAT_001b1e48 == 0) {
        return;
      }
      OclSharedData::resumeDelay(this->m_sharedData,(this->super_Worker).m_id);
      bVar3 = consumeJob(this);
      if (!bVar3) {
        return;
      }
    }
    while (DAT_001b1e48 == (this->m_job).m_sequence) {
      OclSharedData::adjustDelay(this->m_sharedData,(this->super_Worker).m_id);
      lVar8 = std::chrono::_V2::steady_clock::now();
      (*this->m_runner->_vptr_IOclRunner[0xc])
                (this->m_runner,
                 (ulong)*(uint *)((this->m_job).m_blobs[(this->m_job).m_index] + 0x27),local_438);
      if ((ulong)local_3c != 0) {
        bVar1 = (this->m_job).m_index;
        JobResults::submit((Job *)((this->m_job).m_jobs[0].m_blob +
                                  (ulong)bVar1 * 0x100 + (ulong)bVar1 * 8 + -0x78),local_438,
                           (ulong)local_3c);
      }
      uVar2 = this->m_intensity;
      uVar9 = (int)(0x8000 / (ulong)uVar2) + 1;
      bVar1 = (this->m_job).m_index;
      uVar5 = (this->m_job).m_rounds[bVar1] + 1;
      (this->m_job).m_rounds[bVar1] = uVar5;
      uVar6 = *(uint32_t *)((this->m_job).m_blobs[bVar1] + 0x27);
      if (uVar5 % uVar9 == 0) {
        uVar6 = Nonce::next(bVar1,uVar6,uVar9 * uVar2);
        *(uint32_t *)((this->m_job).m_blobs[(this->m_job).m_index] + 0x27) = uVar6;
      }
      else {
        *(uint32_t *)((this->m_job).m_blobs[bVar1] + 0x27) = uVar6 + uVar2;
      }
      storeStats(this,lVar8 / 1000000);
      sched_yield();
    }
    bVar3 = consumeJob(this);
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void xmrig::OclWorker::start()
{
    cl_uint results[0x100];

    while (Nonce::sequence(Nonce::OPENCL) > 0) {
        if (!isReady()) {
            m_sharedData.setResumeCounter(0);

            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (!isReady() && Nonce::sequence(Nonce::OPENCL) > 0);

            if (Nonce::sequence(Nonce::OPENCL) == 0) {
                break;
            }

            m_sharedData.resumeDelay(m_id);

            if (!consumeJob()) {
                return;
            }
        }

        while (!Nonce::isOutdated(Nonce::OPENCL, m_job.sequence())) {
            m_sharedData.adjustDelay(m_id);

            const uint64_t t = Chrono::steadyMSecs();

            try {
                m_runner->run(*m_job.nonce(), results);
            }
            catch (std::exception &ex) {
                printError(id(), ex.what());

                return;
            }

            if (results[0xFF] > 0) {
                JobResults::submit(m_job.currentJob(), results, results[0xFF]);
            }

            m_job.nextRound(roundSize(m_intensity), m_intensity);

            storeStats(t);
            std::this_thread::yield();
        }

        if (!consumeJob()) {
            return;
        }
    }
}